

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForLibrary
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *provided)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined7 extraout_var;
  pointer ppFVar6;
  uint uVar7;
  FileDescriptor *pFVar8;
  bool require_extension;
  long lVar9;
  Generator *pGVar10;
  ulong uVar11;
  long lVar12;
  bool have_message;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_e8;
  ulong local_e0;
  GeneratorOptions *local_d8;
  Printer *local_d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  Generator *local_c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  undefined1 local_80 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  
  local_e8 = files;
  local_d8 = options;
  if (options->import_style != kImportClosure) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&required,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x6f4);
    options = (GeneratorOptions *)
              internal::LogMessage::operator<<
                        ((LogMessage *)&required,
                         "CHECK failed: (options.import_style) == (GeneratorOptions::kImportClosure): "
                        );
    internal::LogFinisher::operator=((LogFinisher *)&forwards,(LogMessage *)options);
    internal::LogMessage::~LogMessage((LogMessage *)&required);
  }
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &required._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar7 = 0;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  required._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &forwards._M_t._M_impl.super__Rb_tree_header._M_header;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  have_message = false;
  ppFVar6 = (local_e8->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       required._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_e8->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
    uVar11 = 0;
    local_e0 = 0;
    require_extension = false;
    local_d0 = printer;
    local_c8 = provided;
    local_c0 = this;
LAB_00250ada:
    pGVar10 = local_c0;
    pFVar8 = ppFVar6[uVar11];
    iVar5 = *(int *)(pFVar8 + 0x2c);
    if (0 < iVar5) {
      lVar12 = 0;
      lVar9 = 0;
      do {
        if (*(char *)(*(long *)(*(long *)(pFVar8 + 0x58) + 0x20 + lVar12) + 0x4b) == '\0') {
          options = local_d8;
          FindRequiresForMessage
                    (pGVar10,local_d8,(Descriptor *)(*(long *)(pFVar8 + 0x58) + lVar12),&required,
                     &forwards,&have_message);
          ppFVar6 = (local_e8->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        lVar9 = lVar9 + 1;
        pFVar8 = ppFVar6[uVar11];
        iVar5 = *(int *)(pFVar8 + 0x2c);
        lVar12 = lVar12 + 0x88;
      } while (lVar9 < iVar5);
    }
    if (!require_extension) {
      iVar4 = *(int *)(pFVar8 + 0x3c);
      if (0 < iVar4) {
        lVar12 = 0;
        lVar9 = 0;
        do {
          if ((*(byte *)(*(long *)(pFVar8 + 0x70) + 1 + lVar12) & 8) != 0) {
            bVar2 = anon_unknown_0::IgnoreField
                              ((FieldDescriptor *)(*(long *)(pFVar8 + 0x70) + lVar12));
            if (!bVar2) goto LAB_00250bab;
            iVar4 = *(int *)(pFVar8 + 0x3c);
          }
          lVar9 = lVar9 + 1;
          lVar12 = lVar12 + 0x48;
        } while (lVar9 < iVar4);
        iVar5 = *(int *)(pFVar8 + 0x2c);
      }
      if (0 < iVar5) {
        lVar12 = 0;
        lVar9 = 0;
        do {
          bVar2 = anon_unknown_0::HasExtensions((Descriptor *)(*(long *)(pFVar8 + 0x58) + lVar12));
          if (bVar2) goto LAB_00250bab;
          lVar9 = lVar9 + 1;
          lVar12 = lVar12 + 0x88;
        } while (lVar9 < *(int *)(pFVar8 + 0x2c));
      }
    }
    goto LAB_00250bad;
  }
  require_extension = false;
  bVar3 = 0;
LAB_00250cfd:
  GenerateRequiresImpl
            ((Generator *)(ulong)(uVar7 & 1),(GeneratorOptions *)(ulong)require_extension,printer,
             &required,&forwards,provided,SUB41(uVar7 & 1,0),require_extension,(bool)(bVar3 & 1));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&forwards._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&required._M_t);
  return;
LAB_00250bab:
  require_extension = true;
LAB_00250bad:
  ppFVar6 = (local_e8->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((local_e0 & 1) == 0) && (pFVar8 = ppFVar6[uVar11], 0 < *(int *)(pFVar8 + 0x2c))) {
    lVar12 = 0;
    lVar9 = 0;
    do {
      bVar2 = anon_unknown_0::HasMap
                        ((GeneratorOptions *)(*(long *)(pFVar8 + 0x58) + lVar12),
                         (Descriptor *)options);
      if (bVar2) {
        local_e0 = CONCAT71(extraout_var,1);
        break;
      }
      lVar9 = lVar9 + 1;
      lVar12 = lVar12 + 0x88;
    } while (lVar9 < *(int *)(pFVar8 + 0x2c));
    ppFVar6 = (local_e8->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  pFVar8 = ppFVar6[uVar11];
  if (0 < *(int *)(pFVar8 + 0x3c)) {
    lVar9 = 0;
    lVar12 = 0;
    do {
      lVar1 = *(long *)(pFVar8 + 0x70);
      bVar2 = anon_unknown_0::IgnoreField((FieldDescriptor *)(lVar1 + lVar9));
      if (!bVar2) {
        pGVar10 = (Generator *)(*(long *)(*(long *)(lVar1 + 0x20 + lVar9) + 8) + 0x20);
        iVar5 = std::__cxx11::string::compare((char *)pGVar10);
        if (iVar5 != 0) {
          (anonymous_namespace)::GetMessagePath_abi_cxx11_
                    ((string *)local_80,
                     (_anonymous_namespace_ *)(local_d8->namespace_prefix)._M_dataplus._M_p,
                     (GeneratorOptions *)(local_d8->namespace_prefix)._M_string_length,
                     *(Descriptor **)(lVar1 + 0x20 + lVar9));
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&required,(string *)local_80);
          pGVar10 = (Generator *)local_80._0_8_;
          if ((Generator *)local_80._0_8_ != (Generator *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_);
          }
        }
        require_extension = true;
        options = local_d8;
        FindRequiresForField
                  (pGVar10,local_d8,(FieldDescriptor *)(lVar1 + lVar9),&required,&forwards);
      }
      lVar12 = lVar12 + 1;
      ppFVar6 = (local_e8->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pFVar8 = ppFVar6[uVar11];
      lVar9 = lVar9 + 0x48;
    } while (lVar12 < *(int *)(pFVar8 + 0x3c));
  }
  uVar11 = uVar11 + 1;
  if ((ulong)((long)(local_e8->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3) <= uVar11)
  goto code_r0x00250ce4;
  goto LAB_00250ada;
code_r0x00250ce4:
  uVar7 = (uint)have_message;
  bVar3 = (byte)local_e0;
  provided = local_c8;
  printer = local_d0;
  goto LAB_00250cfd;
}

Assistant:

void Generator::GenerateRequiresForLibrary(
    const GeneratorOptions& options, io::Printer* printer,
    const std::vector<const FileDescriptor*>& files,
    std::set<std::string>* provided) const {
  GOOGLE_CHECK_EQ(options.import_style, GeneratorOptions::kImportClosure);
  // For Closure imports we need to import every message type individually.
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_extensions = false;
  bool have_map = false;
  bool have_message = false;

  for (int i = 0; i < files.size(); i++) {
    for (int j = 0; j < files[i]->message_type_count(); j++) {
      const Descriptor* desc = files[i]->message_type(j);
      if (!IgnoreMessage(desc)) {
        FindRequiresForMessage(options, desc, &required, &forwards,
                               &have_message);
      }
    }

    if (!have_extensions && HasExtensions(files[i])) {
      have_extensions = true;
    }

    if (!have_map && FileHasMap(options, files[i])) {
      have_map = true;
    }

    for (int j = 0; j < files[i]->extension_count(); j++) {
      const FieldDescriptor* extension = files[i]->extension(j);
      if (IgnoreField(extension)) {
        continue;
      }
      if (extension->containing_type()->full_name() !=
          "google.protobuf.bridge.MessageSet") {
        required.insert(GetMessagePath(options, extension->containing_type()));
      }
      FindRequiresForField(options, extension, &required, &forwards);
      have_extensions = true;
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ have_extensions,
                       /* require_map = */ have_map);
}